

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

char * SoapySDRDevice_readSensor(SoapySDRDevice *device,char *key)

{
  undefined1 *puVar1;
  char *pcVar2;
  allocator local_51;
  string local_50 [32];
  char *local_30 [4];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_00141f38);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_50,key,&local_51);
  (**(code **)(*(long *)device + 0x298))(local_30,device,local_50);
  pcVar2 = strdup(local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string(local_50);
  return pcVar2;
}

Assistant:

char *SoapySDRDevice_readSensor(const SoapySDRDevice *device, const char *key)
{
    __SOAPY_SDR_C_TRY
    return strdup(device->readSensor(key).c_str());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}